

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibuf.c
# Opt level: O3

void * ibuf_reserve_slow(ibuf *ibuf,size_t size)

{
  char *pcVar1;
  char *__src;
  slab *psVar2;
  ulong uVar3;
  ulong size_00;
  size_t __n;
  slab *__dest;
  
  pcVar1 = ibuf->wpos;
  if (pcVar1 + size <= ibuf->end) {
    __assert_fail("ibuf->wpos + size > ibuf->end",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/ibuf.c"
                  ,0x48,"void *ibuf_reserve_slow(struct ibuf *, size_t)");
  }
  __src = ibuf->rpos;
  __n = (long)pcVar1 - (long)__src;
  if (__src <= pcVar1) {
    uVar3 = (long)ibuf->end - (long)ibuf->buf;
    if (uVar3 < size + __n) {
      uVar3 = uVar3 * 2;
      if (uVar3 <= ibuf->start_capacity) {
        uVar3 = ibuf->start_capacity;
      }
      do {
        size_00 = uVar3;
        uVar3 = size_00 * 2;
      } while (size_00 < size + __n);
      psVar2 = slab_get(ibuf->slabc,size_00);
      if (psVar2 == (slab *)0x0) {
        return (void *)0x0;
      }
      __dest = psVar2 + 1;
      memcpy(__dest,ibuf->rpos,__n);
      if (ibuf->buf != (char *)0x0) {
        slab_put(ibuf->slabc,(slab *)(ibuf->buf + -0x30));
      }
      ibuf->buf = (char *)__dest;
      ibuf->end = (char *)((long)&(psVar2->next_in_cache).prev + psVar2->size);
    }
    else {
      memmove(ibuf->buf,__src,__n);
      __dest = (slab *)ibuf->buf;
    }
    ibuf->rpos = (char *)__dest;
    ibuf->wpos = (char *)(__n + (long)__dest);
    return (char *)(__n + (long)__dest);
  }
  __assert_fail("ibuf->wpos >= ibuf->rpos",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/ibuf.h"
                ,0x56,"size_t ibuf_used(struct ibuf *)");
}

Assistant:

void *
ibuf_reserve_slow(struct ibuf *ibuf, size_t size)
{
	assert(ibuf->wpos + size > ibuf->end);
	size_t used = ibuf_used(ibuf);
	size_t capacity = ibuf_capacity(ibuf);
	/*
	 * Check if we have enough space in the
	 * current buffer. In this case de-fragment it
	 * by moving existing data to the beginning.
	 * Otherwise, get a bigger buffer.
	 */
	if (size + used <= capacity) {
		ibuf_unpoison_consumed(ibuf);
		ibuf_unpoison_unallocated(ibuf);
		memmove(ibuf->buf, ibuf->rpos, used);
	} else {
		/* Use start_capacity as allocation factor. */
		size_t new_capacity = capacity * 2;
		if (new_capacity < ibuf->start_capacity)
			new_capacity = ibuf->start_capacity;

		while (new_capacity < used + size)
			new_capacity *= 2;

		struct slab *slab = slab_get(ibuf->slabc, new_capacity);
		if (slab == NULL)
			return NULL;
		char *ptr = (char *) slab_data(slab);
		memcpy(ptr, ibuf->rpos, used);
		if (ibuf->buf)
			slab_put(ibuf->slabc, slab_from_data(ibuf->buf));
		ibuf->buf = ptr;
		ibuf->end = ibuf->buf + slab_capacity(slab);
	}
	ibuf->rpos = ibuf->buf;
	ibuf->wpos = ibuf->rpos + used;
	return ibuf->wpos;
}